

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_refSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  size_t slotIndex;
  ulong pointerLikeValue;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  pointerLikeValue = *arguments;
  if (pointerLikeValue == 0 || (pointerLikeValue & 0xf) != 0) {
    sysbvm_error_nullArgument();
    pointerLikeValue = *arguments;
  }
  sVar1 = sysbvm_pointerLikeType_load(context,pointerLikeValue);
  slotIndex = arguments[1] >> 4;
  if ((arguments[1] & 0xf) == 0) {
    slotIndex = 0;
  }
  sVar1 = sysbvm_tuple_slotAt(context,sVar1,slotIndex);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_refSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[0])) sysbvm_error_nullArgument();

    return sysbvm_tuple_slotAt(context, sysbvm_pointerLikeType_load(context, arguments[0]), sysbvm_tuple_anySize_decode(arguments[1]));
}